

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O0

char16 * JsrtDebugUtils::GetDebugPropertyName(JsrtDebugPropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  _E _Var3;
  undefined4 *puVar4;
  JsrtDebugPropertyId local_14;
  char16_t *pcStack_10;
  JsrtDebugPropertyId propertyId_local;
  
  local_14._value = propertyId._value;
  _Var3 = JsrtDebugPropertyId::operator_cast_to__E(&local_14);
  switch(_Var3) {
  case arguments:
    pcStack_10 = L"arguments";
    break;
  case breakpointId:
    pcStack_10 = L"breakpointId";
    break;
  case className:
    pcStack_10 = L"className";
    break;
  case column:
    pcStack_10 = L"column";
    break;
  case debuggerOnlyProperties:
    pcStack_10 = L"debuggerOnlyProperties";
    break;
  case display:
    pcStack_10 = L"display";
    break;
  case error:
    pcStack_10 = L"error";
    break;
  case exception:
    pcStack_10 = L"exception";
    break;
  case fileName:
    pcStack_10 = L"fileName";
    break;
  case firstStatementColumn:
    pcStack_10 = L"firstStatementColumn";
    break;
  case firstStatementLine:
    pcStack_10 = L"firstStatementLine";
    break;
  case functionCallsReturn:
    pcStack_10 = L"functionCallsReturn";
    break;
  case functionHandle:
    pcStack_10 = L"functionHandle";
    break;
  case globals:
    pcStack_10 = L"globals";
    break;
  case handle:
    pcStack_10 = L"handle";
    break;
  case index:
    pcStack_10 = L"index";
    break;
  case line:
    pcStack_10 = L"line";
    break;
  case lineCount:
    pcStack_10 = L"lineCount";
    break;
  case locals:
    pcStack_10 = L"locals";
    break;
  case name:
    pcStack_10 = L"name";
    break;
  case parentScriptId:
    pcStack_10 = L"parentScriptId";
    break;
  case properties:
    pcStack_10 = L"properties";
    break;
  case propertyAttributes:
    pcStack_10 = L"propertyAttributes";
    break;
  case returnValue:
    pcStack_10 = L"returnValue";
    break;
  case scopes:
    pcStack_10 = L"scopes";
    break;
  case scriptHandle:
    pcStack_10 = L"scriptHandle";
    break;
  case scriptId:
    pcStack_10 = L"scriptId";
    break;
  case scriptType:
    pcStack_10 = L"scriptType";
    break;
  case source:
    pcStack_10 = L"source";
    break;
  case sourceLength:
    pcStack_10 = L"sourceLength";
    break;
  case sourceText:
    pcStack_10 = L"sourceText";
    break;
  case thisObject:
    pcStack_10 = L"thisObject";
    break;
  case totalPropertiesOfObject:
    pcStack_10 = L"totalPropertiesOfObject";
    break;
  case type:
    pcStack_10 = L"type";
    break;
  case uncaught:
    pcStack_10 = L"uncaught";
    break;
  case value:
    pcStack_10 = L"value";
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                       ,0x1f8,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    pcStack_10 = L"";
  }
  return pcStack_10;
}

Assistant:

const char16 * JsrtDebugUtils::GetDebugPropertyName(JsrtDebugPropertyId propertyId)
{
    switch (propertyId)
    {
#define DEBUGOBJECTPROPERTY(name) case JsrtDebugPropertyId::##name: return _u(###name);
#include "JsrtDebugPropertiesEnum.h"
    }

    Assert(false);
    return _u("");
}